

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ly_common.c
# Opt level: O2

LY_ERR ly_strcat(char **dest,char *format,...)

{
  char *pcVar1;
  char in_AL;
  int iVar2;
  size_t sVar3;
  char *__dest;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *addition;
  va_list fp;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  fp[0].reg_save_area = local_c8;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  addition = (char *)0x0;
  fp[0].gp_offset = 0x10;
  fp[0].fp_offset = 0x30;
  fp[0].overflow_arg_area = &stack0x00000008;
  local_b8 = in_RDX;
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  iVar2 = vasprintf(&addition,format,fp);
  pcVar1 = *dest;
  if (pcVar1 == (char *)0x0) {
    *dest = addition;
  }
  else {
    sVar3 = strlen(pcVar1);
    __dest = (char *)ly_realloc(pcVar1,(long)iVar2 + sVar3 + 1);
    pcVar1 = addition;
    *dest = __dest;
    if (__dest == (char *)0x0) {
      return LY_EMEM;
    }
    strcat(__dest,addition);
    *dest = __dest;
    free(pcVar1);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
ly_strcat(char **dest, const char *format, ...)
{
    va_list fp;
    char *addition = NULL;
    size_t len;

    va_start(fp, format);
    len = vasprintf(&addition, format, fp);
    len += (*dest ? strlen(*dest) : 0) + 1;

    if (*dest) {
        *dest = ly_realloc(*dest, len);
        if (!*dest) {
            va_end(fp);
            return LY_EMEM;
        }
        *dest = strcat(*dest, addition);
        free(addition);
    } else {
        *dest = addition;
    }

    va_end(fp);
    return LY_SUCCESS;
}